

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_verify(secp256k1_ge *a)

{
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  secp256k1_fe_verify_magnitude(&a->x,4);
  secp256k1_fe_verify_magnitude(&a->y,3);
  if ((uint)a->infinity < 2) {
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/group_impl.h"
          ,0x53,"test condition failed: a->infinity == 0 || a->infinity == 1");
  abort();
}

Assistant:

static void secp256k1_ge_verify(const secp256k1_ge *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GE_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GE_Y_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}